

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_obj.cpp
# Opt level: O0

Mtbdd __thiscall sylvan::Mtbdd::AndExists(Mtbdd *this,Mtbdd *other,BddSet *variables)

{
  MTBDD from;
  MTBDD *in_RCX;
  BddSet *variables_local;
  Mtbdd *other_local;
  Mtbdd *this_local;
  
  from = mtbdd_and_abstract_plus_RUN(other->mtbdd,(variables->set).bdd,*in_RCX);
  Mtbdd(this,from);
  return (Mtbdd)(MTBDD)this;
}

Assistant:

Mtbdd
Mtbdd::AndExists(const Mtbdd &other, const BddSet &variables) const
{
    return mtbdd_and_exists(mtbdd, other.mtbdd, variables.set.bdd);
}